

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

FileDescriptor * __thiscall
google::protobuf::DescriptorPool::BuildFileFromDatabase
          (DescriptorPool *this,FileDescriptorProto *proto)

{
  Tables *tables;
  FileDescriptor *pFVar1;
  DescriptorBuilder local_d8;
  FileDescriptorProto *local_18;
  FileDescriptorProto *proto_local;
  DescriptorPool *this_local;
  
  local_18 = proto;
  proto_local = (FileDescriptorProto *)this;
  internal::Mutex::AssertHeld(this->mutex_);
  tables = internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::get(&this->tables_);
  DescriptorBuilder::DescriptorBuilder(&local_d8,this,tables,this->default_error_collector_);
  pFVar1 = DescriptorBuilder::BuildFile(&local_d8,local_18);
  DescriptorBuilder::~DescriptorBuilder(&local_d8);
  return pFVar1;
}

Assistant:

const FileDescriptor* DescriptorPool::BuildFileFromDatabase(
    const FileDescriptorProto& proto) const {
  mutex_->AssertHeld();
  return DescriptorBuilder(this, tables_.get(),
                           default_error_collector_).BuildFile(proto);
}